

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O0

MPP_RET dequeue(Kmpp *ctx,MppPortType type,MppTask *task)

{
  MPP_RET ret;
  MppTask *task_local;
  MppPortType type_local;
  Kmpp *ctx_local;
  
  if (ctx->mInitDone == 0) {
    ctx_local._4_4_ = MPP_ERR_INIT;
  }
  else {
    ctx_local._4_4_ = MPP_NOK;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET dequeue(Kmpp *ctx, MppPortType type, MppTask *task)
{
    MPP_RET ret = MPP_NOK;
    (void)type;
    (void)task;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    return ret;
}